

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint preProcessScanlines(uchar **out,size_t *outsize,uchar *in,uint w,uint h,LodePNGInfo *info_png,
                        LodePNGEncoderSettings *settings)

{
  LodePNGColorMode *info;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint extraout_EAX;
  uint extraout_EAX_00;
  size_t bytewidth;
  uchar *puVar9;
  uchar *puVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint y;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  size_t local_240;
  uint passh [7];
  uint passw [7];
  uint passh_1 [7];
  uint passw_1 [7];
  size_t padded_passstart [8];
  size_t passstart [8];
  size_t filter_passstart [8];
  size_t passstart_1 [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  info = &info_png->color;
  uVar7 = lodepng_get_bpp(info);
  if (info_png->interlace_method == 0) {
    uVar15 = uVar7 * w;
    uVar13 = (uVar15 + 7 >> 3) * h;
    uVar11 = uVar13 + h;
    *outsize = (ulong)uVar11;
    puVar9 = (uchar *)malloc((ulong)uVar11);
    *out = puVar9;
    uVar8 = (uint)CONCAT71((int7)((ulong)puVar9 >> 8),puVar9 == (uchar *)0x0);
    if (uVar11 == 0 || puVar9 != (uchar *)0x0) {
      if ((uVar7 < 8) && (uVar7 = uVar15 + 7 & 0xfffffff8, uVar15 != uVar7)) {
        puVar10 = (uchar *)malloc((ulong)uVar13);
        if (puVar10 != (uchar *)0x0) {
          addPaddingBits(puVar10,in,(ulong)uVar7,(ulong)uVar15,h);
          filter(puVar9,puVar10,w,h,info,settings);
        }
        free(puVar10);
        return extraout_EAX_00;
      }
      uVar7 = filter(puVar9,in,w,h,info,settings);
      return uVar7;
    }
  }
  else {
    Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,passstart,w,h,uVar7);
    *outsize = filter_passstart[7];
    puVar9 = (uchar *)malloc(filter_passstart[7]);
    *out = puVar9;
    puVar10 = (uchar *)malloc(passstart[7]);
    if ((puVar9 != (uchar *)0x0) && (passstart[7] == 0 || puVar10 != (uchar *)0x0)) {
      Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,passstart_1,w,h,
                          uVar7);
      if (uVar7 < 8) {
        for (lVar12 = 0; lVar12 != 7; lVar12 = lVar12 + 1) {
          uVar8 = passw_1[lVar12];
          uVar15 = passh_1[lVar12];
          for (uVar11 = 0; uVar11 != uVar15; uVar11 = uVar11 + 1) {
            for (uVar17 = 0; uVar17 != uVar8; uVar17 = uVar17 + 1) {
              uVar16 = (ulong)((ADAM7_DX[lVar12] * (int)uVar17 + ADAM7_IX[lVar12] +
                               (ADAM7_DY[lVar12] * uVar11 + ADAM7_IY[lVar12]) * w) * uVar7);
              local_240 = (ulong)((uVar11 * uVar8 + (int)uVar17) * uVar7) + passstart_1[lVar12] * 8;
              uVar13 = uVar7;
              while (bVar18 = uVar13 != 0, uVar13 = uVar13 - 1, bVar18) {
                uVar14 = uVar16 >> 3;
                bVar6 = (byte)uVar16;
                uVar16 = uVar16 + 1;
                setBitOfReversedStream(&local_240,puVar10,(in[uVar14] >> (~bVar6 & 7) & 1) != 0);
              }
            }
          }
        }
      }
      else {
        uVar17 = (ulong)(uVar7 >> 3);
        for (lVar12 = 0; lVar12 != 7; lVar12 = lVar12 + 1) {
          uVar8 = passh_1[lVar12];
          for (uVar15 = 0; uVar15 != uVar8; uVar15 = uVar15 + 1) {
            uVar11 = passw_1[lVar12];
            uVar13 = uVar11 * uVar15;
            for (uVar16 = 0; uVar16 != uVar11; uVar16 = uVar16 + 1) {
              sVar5 = passstart_1[lVar12];
              uVar1 = ADAM7_DX[lVar12];
              uVar2 = ADAM7_IX[lVar12];
              uVar3 = ADAM7_DY[lVar12];
              uVar4 = ADAM7_IY[lVar12];
              for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
                puVar10[uVar14 + uVar13 * uVar17 + sVar5] =
                     in[uVar14 + ((uVar3 * uVar15 + uVar4) * w + uVar1 * (int)uVar16 + uVar2) *
                                 uVar17];
              }
              uVar13 = uVar13 + 1;
            }
          }
        }
      }
      lVar12 = 0;
      do {
        if (lVar12 == 7) break;
        if (uVar7 < 8) {
          puVar9 = (uchar *)malloc(padded_passstart[lVar12 + 1] - padded_passstart[lVar12]);
          if (puVar9 == (uchar *)0x0) break;
          uVar8 = passw[lVar12];
          uVar11 = uVar8 * uVar7;
          uVar15 = passh[lVar12];
          addPaddingBits(puVar9,puVar10 + passstart[lVar12],(ulong)(uVar11 + 7 & 0xfffffff8),
                         (ulong)uVar11,uVar15);
          uVar8 = filter(*out + filter_passstart[lVar12],puVar9,uVar8,uVar15,info,settings);
          free(puVar9);
        }
        else {
          uVar8 = filter(*out + filter_passstart[lVar12],puVar10 + padded_passstart[lVar12],
                         passw[lVar12],passh[lVar12],info,settings);
        }
        lVar12 = lVar12 + 1;
      } while (uVar8 == 0);
    }
    free(puVar10);
    uVar8 = extraout_EAX;
  }
  return uVar8;
}

Assistant:

static unsigned preProcessScanlines(unsigned char** out, size_t* outsize, const unsigned char* in,
  unsigned w, unsigned h,
  const LodePNGInfo* info_png, const LodePNGEncoderSettings* settings) {
  /*
  This function converts the pure 2D image with the PNG's colortype, into filtered-padded-interlaced data. Steps:
  *) if no Adam7: 1) add padding bits (= possible extra bits per scanline if bpp < 8) 2) filter
  *) if adam7: 1) Adam7_interlace 2) 7x add padding bits 3) 7x filter
  */
  unsigned bpp = lodepng_get_bpp(&info_png->color);
  unsigned error = 0;

  if (info_png->interlace_method == 0) {
    *outsize = h + (h * ((w * bpp + 7u) / 8u)); /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if (!(*out) && (*outsize)) error = 83; /*alloc fail*/

    if (!error) {
      /*non multiple of 8 bits per scanline, padding bits needed per scanline*/
      if (bpp < 8 && w * bpp != ((w * bpp + 7u) / 8u) * 8u) {
        unsigned char* padded = (unsigned char*)lodepng_malloc(h * ((w * bpp + 7u) / 8u));
        if (!padded) error = 83; /*alloc fail*/
        if (!error) {
          addPaddingBits(padded, in, ((w * bpp + 7u) / 8u) * 8u, w * bpp, h);
          error = filter(*out, padded, w, h, &info_png->color, settings);
        }
        lodepng_free(padded);
      }
      else {
        /*we can immediately filter into the out buffer, no other steps needed*/
        error = filter(*out, in, w, h, &info_png->color, settings);
      }
    }
  }
  else /*interlace_method is 1 (Adam7)*/ {
    unsigned passw[7], passh[7];
    size_t filter_passstart[8], padded_passstart[8], passstart[8];
    unsigned char* adam7;

    Adam7_getpassvalues(passw, passh, filter_passstart, padded_passstart, passstart, w, h, bpp);

    *outsize = filter_passstart[7]; /*image size plus an extra byte per scanline + possible padding bits*/
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if (!(*out)) error = 83; /*alloc fail*/

    adam7 = (unsigned char*)lodepng_malloc(passstart[7]);
    if (!adam7 && passstart[7]) error = 83; /*alloc fail*/

    if (!error) {
      unsigned i;

      Adam7_interlace(adam7, in, w, h, bpp);
      for (i = 0; i != 7; ++i) {
        if (bpp < 8) {
          unsigned char* padded = (unsigned char*)lodepng_malloc(padded_passstart[i + 1] - padded_passstart[i]);
          if (!padded) ERROR_BREAK(83); /*alloc fail*/
          addPaddingBits(padded, &adam7[passstart[i]],
            ((passw[i] * bpp + 7u) / 8u) * 8u, passw[i] * bpp, passh[i]);
          error = filter(&(*out)[filter_passstart[i]], padded,
            passw[i], passh[i], &info_png->color, settings);
          lodepng_free(padded);
        }
        else {
          error = filter(&(*out)[filter_passstart[i]], &adam7[padded_passstart[i]],
            passw[i], passh[i], &info_png->color, settings);
        }

        if (error) break;
      }
    }

    lodepng_free(adam7);
  }

  return error;
}